

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.h
# Opt level: O2

void __thiscall
llbuild::buildsystem::ShellCommand::ShellCommand
          (ShellCommand *this,StringRef name,bool controlEnabled)

{
  SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_> *pSVar1;
  SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSVar2;
  
  ExternalCommand::Command(&this->super_ExternalCommand,name);
  (this->super_ExternalCommand).super_Command.super_JobDescriptor._vptr_JobDescriptor =
       (_func_int **)&PTR__ShellCommand_001db1c0;
  (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->signatureData)._M_dataplus._M_p = (pointer)&(this->signatureData).field_2;
  (this->signatureData)._M_string_length = 0;
  (this->signatureData).field_2._M_local_buf[0] = '\0';
  (this->env).super_SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>.
  super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>.
  super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
  super_SmallVectorBase.BeginX =
       &(this->env).super_SmallVectorStorage<std::pair<llvm::StringRef,_llvm::StringRef>,_1U>;
  pSVar1 = &(this->env).super_SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>;
  (pSVar1->super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>).
  super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
  super_SmallVectorBase.Size = 0;
  (pSVar1->super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>).
  super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
  super_SmallVectorBase.Capacity = 1;
  (this->depsPaths).
  super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  .super_SmallVectorBase.BeginX =
       &(this->depsPaths).
        super_SmallVectorStorage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1U>
  ;
  pSVar2 = &(this->depsPaths).
            super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  (pSVar2->
  super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ).
  super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  .super_SmallVectorBase.Size = 0;
  (pSVar2->
  super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ).
  super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  .super_SmallVectorBase.Capacity = 1;
  this->depsStyle = Unused;
  this->inheritEnv = true;
  this->canSafelyInterrupt = true;
  (this->workingDirectory)._M_dataplus._M_p = (pointer)&(this->workingDirectory).field_2;
  (this->workingDirectory)._M_string_length = 0;
  (this->workingDirectory).field_2._M_local_buf[0] = '\0';
  this->controlEnabled = controlEnabled;
  (this->cachedSignature)._M_i.value = 0;
  (this->handlerState)._M_t.
  super___uniq_ptr_impl<llbuild::buildsystem::HandlerState,_std::default_delete<llbuild::buildsystem::HandlerState>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::buildsystem::HandlerState_*,_std::default_delete<llbuild::buildsystem::HandlerState>_>
  .super__Head_base<0UL,_llbuild::buildsystem::HandlerState_*,_false>._M_head_impl =
       (HandlerState *)0x0;
  return;
}

Assistant:

ShellCommand(StringRef name, bool controlEnabled) : ExternalCommand(name),
    controlEnabled(controlEnabled) { }